

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

void on_amqp_frame_received
               (void *context,uint16_t channel,AMQP_VALUE performative,uchar *payload_bytes,
               uint32_t payload_size)

{
  _Bool _Var1;
  char cVar2;
  int iVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  AMQP_VALUE descriptor;
  ENDPOINT_INSTANCE *pEVar4;
  ENDPOINT_HANDLE endpoint;
  CONNECTION_STATE connection_state;
  char *pcVar5;
  OPEN_HANDLE open_handle;
  uint16_t remote_channel;
  ERROR_HANDLE error;
  undefined4 local_50;
  undefined4 uStack_4c;
  uint16_t local_42;
  BEGIN_HANDLE local_40;
  int local_34;
  
  iVar3 = tickcounter_get_current_ms
                    (*(TICK_COUNTER_HANDLE *)((long)context + 0x48),
                     (tickcounter_ms_t *)((long)context + 200));
  if (iVar3 != 0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"on_amqp_frame_received",0x336,1,"Cannot get tickcounter value");
    }
    close_connection_with_error
              ((CONNECTION_HANDLE)context,"amqp:internal-error","cannot get current tick count",
               (AMQP_VALUE)0x0);
    return;
  }
  if ((*(byte *)((long)context + 0xe0) & 1) == 0) {
    return;
  }
  if ((*(uint *)((long)context + 0x10) < 0xe) &&
     ((0x2435U >> (*(uint *)((long)context + 0x10) & 0x1f) & 1) != 0)) {
    iVar3 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    if (iVar3 == 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar5 = "xio_close failed";
    iVar3 = 0x44e;
LAB_0010d2a6:
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
               ,"on_amqp_frame_received",iVar3,1,pcVar5);
    return;
  }
  if (performative == (AMQP_VALUE)0x0) {
    close_connection_with_error
              ((CONNECTION_HANDLE)context,"amqp:internal-error",
               "connection_endpoint_frame_received::NULL performative",(AMQP_VALUE)0x0);
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar5 = "connection_endpoint_frame_received::NULL performative";
    iVar3 = 0x344;
    goto LAB_0010d2a6;
  }
  descriptor = amqpvalue_get_inplace_descriptor(performative);
  if ((*(byte *)((long)context + 0xe0) & 8) != 0) {
    log_incoming_frame(performative);
  }
  _Var1 = is_open_type_by_descriptor(descriptor);
  if (_Var1) {
    if (channel != 0) {
      close_connection_with_error
                ((CONNECTION_HANDLE)context,"amqp:not-allowed",
                 "OPEN frame received on a channel that is not 0",(AMQP_VALUE)0x0);
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                   ,"on_amqp_frame_received",0x356,1,
                   "OPEN frame received on a channel that is not 0");
      }
    }
    iVar3 = *(int *)((long)context + 0x10);
    if ((iVar3 != 3) && (iVar3 != 7)) {
      if (iVar3 != 9) {
        return;
      }
      close_connection_with_error
                ((CONNECTION_HANDLE)context,"amqp:illegal-state",
                 "OPEN frame received in the OPENED state",(AMQP_VALUE)0x0);
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar5 = "OPEN frame received in the OPENED state";
      iVar3 = 0x35d;
      goto LAB_0010d2a6;
    }
    iVar3 = amqpvalue_get_open(performative,(OPEN_HANDLE *)&local_50);
    if (iVar3 == 0) {
      iVar3 = open_get_idle_time_out
                        ((OPEN_HANDLE)CONCAT44(uStack_4c,local_50),
                         (milliseconds *)((long)context + 0xb4));
      if (iVar3 == 0) {
        *(int *)((long)context + 0xb8) =
             (int)(long)((double)*(uint *)((long)context + 0xb4) * *(double *)((long)context + 0xc0)
                        );
      }
      iVar3 = open_get_max_frame_size
                        ((OPEN_HANDLE)CONCAT44(uStack_4c,local_50),
                         (uint32_t *)((long)context + 0x50));
      if ((iVar3 == 0) && (0x1ff < *(uint32_t *)((long)context + 0x50))) {
        if ((*(int *)((long)context + 0x10) == 7) ||
           (iVar3 = send_open_frame((CONNECTION_HANDLE)context), iVar3 == 0)) {
          connection_state = CONNECTION_STATE_OPENED;
        }
        else {
          connection_state = CONNECTION_STATE_END;
        }
        connection_set_state((CONNECTION_HANDLE)context,connection_state);
      }
      else {
        close_connection_with_error
                  ((CONNECTION_HANDLE)context,"amqp:invalid-field",
                   "connection_endpoint_frame_received::failed parsing OPEN frame",(AMQP_VALUE)0x0);
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                     ,"on_amqp_frame_received",0x379,1,
                     "connection_endpoint_frame_received::failed parsing OPEN frame");
        }
      }
      open_destroy((OPEN_HANDLE)CONCAT44(uStack_4c,local_50));
      return;
    }
    close_connection_with_error
              ((CONNECTION_HANDLE)context,"amqp:invalid-field",
               "connection_endpoint_frame_received::failed parsing OPEN frame",(AMQP_VALUE)0x0);
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar5 = "connection_endpoint_frame_received::failed parsing OPEN frame";
    iVar3 = 0x368;
LAB_0010d506:
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
               ,"on_amqp_frame_received",iVar3,1,pcVar5);
    return;
  }
  _Var1 = is_close_type_by_descriptor(descriptor);
  if (_Var1) {
    if ((*(uint *)((long)context + 0x10) < 0xd) &&
       ((0x184aU >> (*(uint *)((long)context + 0x10) & 0x1f) & 1) != 0)) {
      iVar3 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      if (iVar3 == 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar5 = "xio_close failed";
      iVar3 = 0x3a7;
      goto LAB_0010d2a6;
    }
    if (*(ushort *)((long)context + 0xac) < channel) {
      close_connection_with_error
                ((CONNECTION_HANDLE)context,"amqp:invalid-field",
                 "connection_endpoint_frame_received::failed parsing CLOSE frame",(AMQP_VALUE)0x0);
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar5 = "connection_endpoint_frame_received::failed parsing CLOSE frame";
      iVar3 = 0x3b2;
    }
    else {
      iVar3 = amqpvalue_get_close(performative,(CLOSE_HANDLE *)&local_50);
      if (iVar3 == 0) {
        iVar3 = close_get_error((CLOSE_HANDLE)CONCAT44(uStack_4c,local_50),(ERROR_HANDLE *)&local_40
                               );
        if (iVar3 != 0) {
          local_40 = (BEGIN_HANDLE)0x0;
        }
        close_destroy((CLOSE_HANDLE)CONCAT44(uStack_4c,local_50));
        connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_CLOSE_RCVD);
        iVar3 = send_close_frame((CONNECTION_HANDLE)context,(ERROR_HANDLE)0x0);
        if ((iVar3 != 0) &&
           (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
           UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                     ,"on_amqp_frame_received",0x3ca,1,"Cannot send CLOSE frame");
        }
        iVar3 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
        if ((iVar3 != 0) &&
           (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
           UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                     ,"on_amqp_frame_received",0x3d0,1,"xio_close failed");
        }
        connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_END);
        if (*(code **)((long)context + 0x98) != (code *)0x0) {
          (**(code **)((long)context + 0x98))(*(undefined8 *)((long)context + 0xa0),local_40);
        }
        error_destroy((ERROR_HANDLE)local_40);
        return;
      }
      close_connection_with_error
                ((CONNECTION_HANDLE)context,"amqp:invalid-field",
                 "connection_endpoint_frame_received::failed parsing CLOSE frame",(AMQP_VALUE)0x0);
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar5 = "connection_endpoint_frame_received::failed parsing CLOSE frame";
      iVar3 = 0x3b9;
    }
    goto LAB_0010d506;
  }
  iVar3 = amqpvalue_get_ulong(descriptor,(uint64_t *)&local_50);
  if (iVar3 != 0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar5 = "Failed getting ulong amqp performative";
    iVar3 = 0x3e5;
    goto LAB_0010d506;
  }
  if (CONCAT44(uStack_4c,local_50) - 0x12U < 6) {
    pEVar4 = find_session_endpoint_by_incoming_channel((CONNECTION_HANDLE)context,channel);
    if (pEVar4 != (ENDPOINT_INSTANCE *)0x0) {
      (*pEVar4->on_endpoint_frame_received)
                (pEVar4->callback_context,performative,payload_size,payload_bytes);
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar5 = "Cannot find session endpoint for channel %u";
    iVar3 = 0x431;
    goto LAB_0010d506;
  }
  if (CONCAT44(uStack_4c,local_50) != 0x11) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar5 = "Bad performative: %02x";
    iVar3 = 0x3ec;
    goto LAB_0010d506;
  }
  iVar3 = amqpvalue_get_begin(performative,&local_40);
  if (iVar3 != 0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar5 = "Cannot get begin performative";
    iVar3 = 0x3f5;
    goto LAB_0010d506;
  }
  local_34 = begin_get_remote_channel(local_40,&local_42);
  if ((local_34 != 0) && (*(long *)((long)context + 0x68) != 0)) {
    endpoint = connection_create_endpoint((CONNECTION_HANDLE)context);
    cVar2 = (**(code **)((long)context + 0x68))(*(undefined8 *)((long)context + 0x70),endpoint);
    if (cVar2 != '\0') goto LAB_0010d8dd;
    connection_destroy_endpoint(endpoint);
  }
  endpoint = (ENDPOINT_HANDLE)0x0;
LAB_0010d8dd:
  if (local_34 == 0) {
    pEVar4 = find_session_endpoint_by_outgoing_channel((CONNECTION_HANDLE)context,local_42);
    if (pEVar4 == (ENDPOINT_INSTANCE *)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                   ,"on_amqp_frame_received",0x410,1,"Cannot create session endpoint");
      }
    }
    else {
      pEVar4->incoming_channel = channel;
      (*pEVar4->on_endpoint_frame_received)
                (pEVar4->callback_context,performative,payload_size,payload_bytes);
    }
  }
  else if (endpoint != (ENDPOINT_HANDLE)0x0) {
    endpoint->incoming_channel = channel;
    (*endpoint->on_endpoint_frame_received)
              (endpoint->callback_context,performative,payload_size,payload_bytes);
  }
  begin_destroy(local_40);
  return;
}

Assistant:

static void on_amqp_frame_received(void* context, uint16_t channel, AMQP_VALUE performative, const unsigned char* payload_bytes, uint32_t payload_size)
{
    CONNECTION_HANDLE connection = (CONNECTION_HANDLE)context;

    (void)channel;

    if (tickcounter_get_current_ms(connection->tick_counter, &connection->last_frame_received_time) != 0)
    {
        LogError("Cannot get tickcounter value");
        close_connection_with_error(connection, "amqp:internal-error", "cannot get current tick count", NULL);
    }
    else
    {
        if (connection->is_underlying_io_open)
        {
            switch (connection->connection_state)
            {
            default:
                if (performative == NULL)
                {
                    /* Codes_S_R_S_CONNECTION_01_223: [If the on_endpoint_frame_received is called with a NULL performative then the connection shall be closed with the error condition amqp:internal-error and an implementation defined error description.] */
                    close_connection_with_error(connection, "amqp:internal-error", "connection_endpoint_frame_received::NULL performative", NULL);
                    LogError("connection_endpoint_frame_received::NULL performative");
                }
                else
                {
                    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

                    if (connection->is_trace_on == 1)
                    {
                        log_incoming_frame(performative);
                    }

                    if (is_open_type_by_descriptor(descriptor))
                    {
                        if (channel != 0)
                        {
                            /* Codes_S_R_S_CONNECTION_01_006: [The open frame can only be sent on channel 0.] */
                            /* Codes_S_R_S_CONNECTION_01_222: [If an Open frame is received in a manner violating the ISO specification, the connection shall be closed with condition amqp:not-allowed and description being an implementation defined string.] */
                            close_connection_with_error(connection, "amqp:not-allowed", "OPEN frame received on a channel that is not 0", NULL);
                            LogError("OPEN frame received on a channel that is not 0");
                        }

                        if (connection->connection_state == CONNECTION_STATE_OPENED)
                        {
                            /* Codes_S_R_S_CONNECTION_01_239: [If an Open frame is received in the Opened state the connection shall be closed with condition amqp:illegal-state and description being an implementation defined string.] */
                            close_connection_with_error(connection, "amqp:illegal-state", "OPEN frame received in the OPENED state", NULL);
                            LogError("OPEN frame received in the OPENED state");
                        }
                        else if ((connection->connection_state == CONNECTION_STATE_OPEN_SENT) ||
                            (connection->connection_state == CONNECTION_STATE_HDR_EXCH))
                        {
                            OPEN_HANDLE open_handle;
                            if (amqpvalue_get_open(performative, &open_handle) != 0)
                            {
                                /* Codes_S_R_S_CONNECTION_01_143: [If any of the values in the received open frame are invalid then the connection shall be closed.] */
                                /* Codes_S_R_S_CONNECTION_01_220: [The error amqp:invalid-field shall be set in the error.condition field of the CLOSE frame.] */
                                close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing OPEN frame", NULL);
                                LogError("connection_endpoint_frame_received::failed parsing OPEN frame");
                            }
                            else
                            {
                                if (open_get_idle_time_out(open_handle, &connection->remote_idle_timeout) == 0)
                                {
                                    /* since we obtained the remote_idle_timeout, compute at what millisecond we should send the empty frame */
                                    connection->remote_idle_timeout_send_frame_millisecond = (milliseconds)(connection->idle_timeout_empty_frame_send_ratio * connection->remote_idle_timeout);
                                }

                                if ((open_get_max_frame_size(open_handle, &connection->remote_max_frame_size) != 0) ||
                                    /* Codes_S_R_S_CONNECTION_01_167: [Both peers MUST accept frames of up to 512 (MIN-MAX-FRAME-SIZE) octets.] */
                                    (connection->remote_max_frame_size < 512))
                                {
                                    /* Codes_S_R_S_CONNECTION_01_143: [If any of the values in the received open frame are invalid then the connection shall be closed.] */
                                    /* Codes_S_R_S_CONNECTION_01_220: [The error amqp:invalid-field shall be set in the error.condition field of the CLOSE frame.] */
                                    close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing OPEN frame", NULL);
                                    LogError("connection_endpoint_frame_received::failed parsing OPEN frame");
                                }
                                else
                                {
                                    if (connection->connection_state == CONNECTION_STATE_OPEN_SENT)
                                    {
                                        connection_set_state(connection, CONNECTION_STATE_OPENED);
                                    }
                                    else
                                    {
                                        if (send_open_frame(connection) != 0)
                                        {
                                            connection_set_state(connection, CONNECTION_STATE_END);
                                        }
                                        else
                                        {
                                            connection_set_state(connection, CONNECTION_STATE_OPENED);
                                        }
                                    }
                                }

                                open_destroy(open_handle);
                            }
                        }
                        else
                        {
                            /* do nothing for now ... */
                        }
                    }
                    else if (is_close_type_by_descriptor(descriptor))
                    {
                        /* Codes_S_R_S_CONNECTION_01_242: [The connection module shall accept CLOSE frames even if they have extra payload bytes besides the Close performative.] */

                        /* Codes_S_R_S_CONNECTION_01_225: [HDR_RCVD HDR OPEN] */
                        if ((connection->connection_state == CONNECTION_STATE_HDR_RCVD) ||
                            /* Codes_S_R_S_CONNECTION_01_227: [HDR_EXCH OPEN OPEN] */
                            (connection->connection_state == CONNECTION_STATE_HDR_EXCH) ||
                            /* Codes_S_R_S_CONNECTION_01_228: [OPEN_RCVD OPEN *] */
                            (connection->connection_state == CONNECTION_STATE_OPEN_RCVD) ||
                            /* Codes_S_R_S_CONNECTION_01_235: [CLOSE_SENT - * TCP Close for Write] */
                            (connection->connection_state == CONNECTION_STATE_CLOSE_SENT) ||
                            /* Codes_S_R_S_CONNECTION_01_236: [DISCARDING - * TCP Close for Write] */
                            (connection->connection_state == CONNECTION_STATE_DISCARDING))
                        {
                            if (xio_close(connection->io, NULL, NULL) != 0)
                            {
                                LogError("xio_close failed");
                            }
                        }
                        else
                        {
                            CLOSE_HANDLE close_handle;

                            /* Codes_S_R_S_CONNECTION_01_012: [A close frame MAY be received on any channel up to the maximum channel number negotiated in open.] */
                            if (channel > connection->channel_max)
                            {
                                close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing CLOSE frame", NULL);
                                LogError("connection_endpoint_frame_received::failed parsing CLOSE frame");
                            }
                            else
                            {
                                if (amqpvalue_get_close(performative, &close_handle) != 0)
                                {
                                    close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing CLOSE frame", NULL);
                                    LogError("connection_endpoint_frame_received::failed parsing CLOSE frame");
                                }
                                else
                                {
                                    ERROR_HANDLE error;

                                    if (close_get_error(close_handle, &error) != 0)
                                    {
                                        error = NULL;
                                    }

                                    close_destroy(close_handle);

                                    connection_set_state(connection, CONNECTION_STATE_CLOSE_RCVD);

                                    if (send_close_frame(connection, NULL) != 0)
                                    {
                                        LogError("Cannot send CLOSE frame");
                                    }

                                    /* Codes_S_R_S_CONNECTION_01_214: [If the close frame cannot be constructed or sent, the connection shall be closed and set to the END state.] */
                                    if (xio_close(connection->io, NULL, NULL) != 0)
                                    {
                                        LogError("xio_close failed");
                                    }

                                    connection_set_state(connection, CONNECTION_STATE_END);

                                    if (connection->on_connection_close_received_event_subscription.on_connection_close_received != NULL)
                                    {
                                        connection->on_connection_close_received_event_subscription.on_connection_close_received(connection->on_connection_close_received_event_subscription.context, error);
                                    }

                                    error_destroy(error);
                                }
                            }
                        }
                    }
                    else
                    {
                        uint64_t performative_ulong;

                        if (amqpvalue_get_ulong(descriptor, &performative_ulong) != 0)
                        {
                            LogError("Failed getting ulong amqp performative");
                        }
                        else
                        {
                            switch (performative_ulong)
                            {
                            default:
                                LogError("Bad performative: %02x", (unsigned int)performative_ulong);
                                break;

                            case AMQP_BEGIN:
                            {
                                BEGIN_HANDLE begin;

                                if (amqpvalue_get_begin(performative, &begin) != 0)
                                {
                                    LogError("Cannot get begin performative");
                                }
                                else
                                {
                                    uint16_t remote_channel;
                                    ENDPOINT_HANDLE new_endpoint = NULL;
                                    bool remote_begin = false;

                                    if (begin_get_remote_channel(begin, &remote_channel) != 0)
                                    {
                                        remote_begin = true;
                                        if (connection->on_new_endpoint != NULL)
                                        {
                                            new_endpoint = connection_create_endpoint(connection);
                                            if (!connection->on_new_endpoint(connection->on_new_endpoint_callback_context, new_endpoint))
                                            {
                                                connection_destroy_endpoint(new_endpoint);
                                                new_endpoint = NULL;
                                            }
                                        }
                                    }

                                    if (!remote_begin)
                                    {
                                        ENDPOINT_INSTANCE* session_endpoint = find_session_endpoint_by_outgoing_channel(connection, remote_channel);
                                        if (session_endpoint == NULL)
                                        {
                                            LogError("Cannot create session endpoint");
                                        }
                                        else
                                        {
                                            session_endpoint->incoming_channel = channel;
                                            session_endpoint->on_endpoint_frame_received(session_endpoint->callback_context, performative, payload_size, payload_bytes);
                                        }
                                    }
                                    else
                                    {
                                        if (new_endpoint != NULL)
                                        {
                                            new_endpoint->incoming_channel = channel;
                                            new_endpoint->on_endpoint_frame_received(new_endpoint->callback_context, performative, payload_size, payload_bytes);
                                        }
                                    }

                                    begin_destroy(begin);
                                }

                                break;
                            }

                            case AMQP_FLOW:
                            case AMQP_TRANSFER:
                            case AMQP_DISPOSITION:
                            case AMQP_END:
                            case AMQP_ATTACH:
                            case AMQP_DETACH:
                            {
                                ENDPOINT_INSTANCE* session_endpoint = find_session_endpoint_by_incoming_channel(connection, channel);
                                if (session_endpoint == NULL)
                                {
                                    LogError("Cannot find session endpoint for channel %u", (unsigned int)channel);
                                }
                                else
                                {
                                    session_endpoint->on_endpoint_frame_received(session_endpoint->callback_context, performative, payload_size, payload_bytes);
                                }

                                break;
                            }
                            }
                        }
                    }
                }
                break;

            case CONNECTION_STATE_START:
                /* Codes_S_R_S_CONNECTION_01_224: [START HDR HDR] */
            case CONNECTION_STATE_HDR_SENT:
                /* Codes_S_R_S_CONNECTION_01_226: [HDR_SENT OPEN HDR] */
            case CONNECTION_STATE_OPEN_PIPE:
                /* Codes_S_R_S_CONNECTION_01_230: [OPEN_PIPE ** HDR] */
            case CONNECTION_STATE_OC_PIPE:
                /* Codes_S_R_S_CONNECTION_01_232: [OC_PIPE - HDR TCP Close for Write] */
            case CONNECTION_STATE_CLOSE_RCVD:
                /* Codes_S_R_S_CONNECTION_01_234: [CLOSE_RCVD * - TCP Close for Read] */
            case CONNECTION_STATE_END:
                /* Codes_S_R_S_CONNECTION_01_237: [END - - TCP Close] */
                if (xio_close(connection->io, NULL, NULL) != 0)
                {
                    LogError("xio_close failed");
                }
                break;
            }
        }
    }
}